

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
::
AnalyzeElements<__gnu_cxx::__normal_iterator<prometheus::ClientMetric::Label_const*,std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>>>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
          *this,__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                elem_first,
          __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
          elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  pointer pcVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  vector<char,_std::allocator<char>_> did_match;
  DummyMatchResultListener dummy;
  allocator_type local_99;
  vector<char,_std::allocator<char>_> local_98;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_80;
  Label *local_78;
  MatchResultListener *local_70;
  size_t local_68;
  string local_60;
  MatchResultListener local_40;
  
  local_80 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)element_printouts;
  local_70 = listener;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(element_printouts);
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001ae7b8;
  local_78 = elem_last._M_current;
  if (elem_first._M_current == elem_last._M_current) {
    lVar3 = *(long *)(this + 0x28);
    lVar1 = *(long *)(this + 0x30);
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      local_68 = sVar6;
      if (local_70->stream_ != (ostream *)0x0) {
        PrintToString<prometheus::ClientMetric::Label>(&local_60,elem_first._M_current);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_80,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_))
          ;
        }
      }
      lVar1 = *(long *)(this + 0x30);
      lVar3 = lVar1;
      if (lVar1 != *(long *)(this + 0x28)) {
        lVar7 = 0;
        lVar5 = 0;
        lVar3 = *(long *)(this + 0x28);
        do {
          local_60._M_dataplus._M_p._0_1_ =
               MatcherBase<const_prometheus::ClientMetric::Label_&>::MatchAndExplain
                         ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)(lVar3 + lVar7),
                          elem_first._M_current,&local_40);
          if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char *)&local_60);
          }
          else {
            *local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_60._M_dataplus._M_p._0_1_;
            local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar5 = lVar5 + 1;
          lVar3 = *(long *)(this + 0x28);
          lVar1 = *(long *)(this + 0x30);
          lVar7 = lVar7 + 0x18;
        } while (lVar5 != (lVar1 - lVar3 >> 3) * -0x5555555555555555);
      }
      sVar6 = local_68 + 1;
      elem_first._M_current = elem_first._M_current + 1;
    } while (elem_first._M_current != local_78);
  }
  sVar2 = (lVar1 - lVar3 >> 3) * -0x5555555555555555;
  __return_storage_ptr__->num_elements_ = sVar6;
  __return_storage_ptr__->num_matchers_ = sVar2;
  local_60._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->matched_,sVar2 * sVar6,(value_type *)&local_60,&local_99);
  if (sVar6 != 0) {
    lVar1 = *(long *)(this + 0x28);
    lVar3 = *(long *)(this + 0x30);
    sVar2 = 0;
    pcVar4 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar8 = lVar3 != lVar1;
      lVar3 = lVar1;
      if (bVar8) {
        lVar3 = 0;
        do {
          (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl
          .super__Vector_impl_data._M_start[lVar3 + __return_storage_ptr__->num_matchers_ * sVar2] =
               pcVar4[lVar3] != '\0';
          lVar3 = lVar3 + 1;
          lVar1 = *(long *)(this + 0x28);
        } while (lVar3 != (*(long *)(this + 0x30) - lVar1 >> 3) * -0x5555555555555555);
        pcVar4 = pcVar4 + lVar3;
        lVar3 = *(long *)(this + 0x30);
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != sVar6);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }